

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::GeneratedExtensionFinder::Find
          (GeneratedExtensionFinder *this,int number,ExtensionInfo *output)

{
  anon_struct_8_0_00000001_for___align aVar1;
  undefined8 uVar2;
  void *pvVar3;
  __node_ptr p_Var4;
  bool bVar5;
  key_type local_38;
  
  if ((anonymous_namespace)::global_registry ==
      (_Hashtable<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::ExtensionInfo,_std::allocator<google::protobuf::internal::ExtensionInfo>,_std::__detail::_Identity,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
       *)0x0) {
    bVar5 = false;
  }
  else {
    local_38.message = this->extendee_;
    local_38.type = '\0';
    local_38.is_repeated = false;
    local_38.is_packed = false;
    local_38.descriptor = (FieldDescriptor *)0x0;
    local_38.field_5.enum_validity_check.func = (EnumValidityFuncWithArg *)0x0;
    local_38.field_5.enum_validity_check.arg = (void *)0x0;
    bVar5 = false;
    local_38.number = number;
    p_Var4 = std::
             _Hashtable<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::ExtensionInfo,_std::allocator<google::protobuf::internal::ExtensionInfo>,_std::__detail::_Identity,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             ::_M_find_node((anonymous_namespace)::global_registry,
                            ((long)number ^ (ulong)local_38.message) %
                            (anonymous_namespace)::global_registry->_M_bucket_count,&local_38,
                            (long)number ^ (ulong)local_38.message);
    if (p_Var4 != (__node_ptr)0x0) {
      output->descriptor =
           *(FieldDescriptor **)
            ((long)&(p_Var4->super__Hash_node_value<google::protobuf::internal::ExtensionInfo,_true>
                    ).super__Hash_node_value_base<google::protobuf::internal::ExtensionInfo>.
                    _M_storage._M_storage + 0x20);
      aVar1 = (p_Var4->super__Hash_node_value<google::protobuf::internal::ExtensionInfo,_true>).
              super__Hash_node_value_base<google::protobuf::internal::ExtensionInfo>._M_storage.
              _M_storage.__align;
      uVar2 = *(undefined8 *)
               ((long)&(p_Var4->
                       super__Hash_node_value<google::protobuf::internal::ExtensionInfo,_true>).
                       super__Hash_node_value_base<google::protobuf::internal::ExtensionInfo>.
                       _M_storage._M_storage + 8);
      pvVar3 = *(void **)((long)&(p_Var4->
                                 super__Hash_node_value<google::protobuf::internal::ExtensionInfo,_true>
                                 ).
                                 super__Hash_node_value_base<google::protobuf::internal::ExtensionInfo>
                                 ._M_storage._M_storage + 0x18);
      (output->field_5).enum_validity_check.func =
           *(EnumValidityFuncWithArg **)
            ((long)&(p_Var4->super__Hash_node_value<google::protobuf::internal::ExtensionInfo,_true>
                    ).super__Hash_node_value_base<google::protobuf::internal::ExtensionInfo>.
                    _M_storage._M_storage + 0x10);
      (output->field_5).enum_validity_check.arg = pvVar3;
      output->message = (MessageLite *)aVar1;
      output->number = (int)uVar2;
      output->type = (char)((ulong)uVar2 >> 0x20);
      output->is_repeated = (bool)(char)((ulong)uVar2 >> 0x28);
      output->is_packed = (bool)(char)((ulong)uVar2 >> 0x30);
      output->field_0xf = (char)((ulong)uVar2 >> 0x38);
      bVar5 = true;
    }
  }
  return bVar5;
}

Assistant:

bool GeneratedExtensionFinder::Find(int number, ExtensionInfo* output) {
  const ExtensionInfo* extension = FindRegisteredExtension(extendee_, number);
  if (extension == nullptr) {
    return false;
  } else {
    *output = *extension;
    return true;
  }
}